

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O2

bool deqp::gls::pixelNearLineIntersection(int x,int y,Surface *target)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  
  iVar3 = x + (y + -1) * target->m_width + -1;
  iVar5 = 0;
  for (iVar4 = -1; iVar4 != 2; iVar4 = iVar4 + 1) {
    for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
      uVar1 = *(uint *)((long)(target->m_pixels).m_ptr + (long)(iVar3 + (int)lVar6) * 4);
      if (((uVar1 & 0xffffff) != 0) && (3 < iVar5 + 1)) goto LAB_0046e835;
      iVar2 = iVar5 + 1;
      if ((uVar1 & 0xffffff) == 0) {
        iVar2 = iVar5;
      }
      iVar5 = iVar2;
    }
    iVar3 = iVar3 + target->m_width;
  }
LAB_0046e835:
  return iVar4 < 2;
}

Assistant:

static bool pixelNearLineIntersection (int x, int y, const tcu::Surface& target)
{
	// should not be called for edge pixels
	DE_ASSERT(x >= 1 && x <= target.getWidth()-2);
	DE_ASSERT(y >= 1 && y <= target.getHeight()-2);

	int coveredPixels = 0;

	for (int dy = -1; dy < 2; dy++)
	for (int dx = -1; dx < 2; dx++)
	{
		const bool targetCoverage = !isBlack(target.getPixel(x+dx, y+dy));
		if (targetCoverage)
		{
			++coveredPixels;

			// A single thin line cannot have more than 3 covered pixels in a 3x3 area
			if (coveredPixels >= 4)
				return true;
		}
	}

	return false;
}